

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::BuiltinPrecisionTests::intervalToString<tcu::Matrix<float,3,2>>
          (string *__return_storage_ptr__,BuiltinPrecisionTests *this,FloatFormat *fmt,IVal *ival)

{
  ostringstream oss;
  ostream oStack_198;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_198);
  printIVal<tcu::Matrix<float,3,2>>((FloatFormat *)this,(IVal *)fmt,&oStack_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_198);
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}